

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O2

bool GifEnd(GifWriter *writer)

{
  FILE *__stream;
  
  __stream = (FILE *)writer->f;
  if (__stream != (FILE *)0x0) {
    fputc(0x3b,__stream);
    fclose((FILE *)writer->f);
    free(writer->oldImage);
    writer->f = (FILE *)0x0;
    writer->oldImage = (uint8_t *)0x0;
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool GifEnd( GifWriter* writer )
{
    if(!writer->f) return false;

    fputc(0x3b, writer->f); // end of file
    fclose(writer->f);
    GIF_FREE(writer->oldImage);

    writer->f = NULL;
    writer->oldImage = NULL;

    return true;
}